

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splines.h
# Opt level: O0

array<pbrt::Point3<float>,_3> * pbrt::QuadraticBSplineToBezier(span<const_pbrt::Point3<float>_> cp)

{
  undefined8 uVar1;
  float fVar2;
  initializer_list<pbrt::Point3<float>_> v;
  Tuple3<pbrt::Point3,_float> t1;
  Tuple3<pbrt::Point3,_float> t1_00;
  Tuple3<pbrt::Point3,_float> t0;
  Tuple3<pbrt::Point3,_float> t0_00;
  Point3<float> *pPVar3;
  array<pbrt::Point3<float>,_3> *in_RDI;
  undefined1 auVar6 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  Point3<float> PVar7;
  Point3<float> PVar8;
  Point3f p22;
  Point3f p11;
  Tuple3<pbrt::Point3,_float> local_fc;
  undefined8 local_f0;
  float local_e8;
  undefined4 local_e4;
  Float in_stack_ffffffffffffff84;
  undefined8 uVar9;
  undefined4 in_stack_ffffffffffffff98;
  float fVar10;
  undefined4 in_stack_ffffffffffffff9c;
  float fVar11;
  undefined4 in_stack_ffffffffffffffbc;
  float fVar12;
  span<const_pbrt::Point3<float>_> local_10;
  
  pPVar3 = pstd::span<const_pbrt::Point3<float>_>::operator[](&local_10,0);
  fVar11 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
  pPVar3 = pstd::span<const_pbrt::Point3<float>_>::operator[](&local_10,1);
  fVar2 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
  auVar6 = (undefined1  [56])0x0;
  t0.y = (float)in_stack_ffffffffffffffbc;
  t0.x = fVar11;
  t0.z = fVar2;
  t1.y = (float)in_stack_ffffffffffffff9c;
  t1.x = (float)in_stack_ffffffffffffff98;
  t1.z = fVar2;
  fVar12 = fVar2;
  PVar7 = Lerp<pbrt::Point3,float>(in_stack_ffffffffffffff84,t0,t1);
  auVar4._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  uVar1 = vmovlpd_avx(auVar4._0_16_);
  fVar10 = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  pstd::span<const_pbrt::Point3<float>_>::operator[](&local_10,1);
  pstd::span<const_pbrt::Point3<float>_>::operator[](&local_10,2);
  auVar6 = (undefined1  [56])0x0;
  t0_00.y = (float)in_stack_ffffffffffffffbc;
  t0_00.x = fVar11;
  t0_00.z = fVar12;
  t1_00.y = (float)in_stack_ffffffffffffff9c;
  t1_00.x = fVar10;
  t1_00.z = fVar2;
  PVar8 = Lerp<pbrt::Point3,float>(in_stack_ffffffffffffff84,t0_00,t1_00);
  auVar5._0_8_ = PVar8.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  uVar9 = vmovlpd_avx(auVar5._0_16_);
  local_fc._0_8_ = uVar1;
  local_fc.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  pPVar3 = pstd::span<const_pbrt::Point3<float>_>::operator[](&local_10,1);
  local_f0._0_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
  local_f0._4_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
  local_e8 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
  local_e4 = (undefined4)uVar9;
  v._M_len = 3;
  v._M_array = (iterator)&local_fc;
  pstd::array<pbrt::Point3<float>,_3>::array
            ((array<pbrt::Point3<float>,_3> *)
             CONCAT44(PVar8.super_Tuple3<pbrt::Point3,_float>.z,(int)((ulong)uVar9 >> 0x20)),v);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU inline pstd::array<Point3f, 3> QuadraticBSplineToBezier(
    pstd::span<const Point3f> cp) {
    // We can compute equivalent Bezier control points via some blossoming.
    // We have three control points and a uniform knot vector; we will label
    // the points p01, p12, and p23.  We want the Bezier control points of
    // the equivalent curve, which are p11, p12, and p22.  We already have
    // p12.
    Point3f p11 = Lerp(0.5, cp[0], cp[1]);
    Point3f p22 = Lerp(0.5, cp[1], cp[2]);
    return {p11, cp[1], p22};
}